

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

ReservedRange * __thiscall
google::protobuf::EnumDescriptor::FindReservedRangeContainingNumber(EnumDescriptor *this,int number)

{
  ReservedRange *pRVar1;
  long lVar2;
  
  lVar2 = (long)*(int *)(this + 0x38);
  if (0 < lVar2) {
    pRVar1 = *(ReservedRange **)(this + 0x40);
    do {
      if ((pRVar1->start <= number) && (number <= pRVar1->end)) {
        return pRVar1;
      }
      pRVar1 = pRVar1 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return (ReservedRange *)0x0;
}

Assistant:

const EnumDescriptor::ReservedRange*
EnumDescriptor::FindReservedRangeContainingNumber(int number) const {
  // TODO(chrisn): Consider a non-linear search.
  for (int i = 0; i < reserved_range_count(); i++) {
    if (number >= reserved_range(i)->start &&
        number <= reserved_range(i)->end) {
      return reserved_range(i);
    }
  }
  return nullptr;
}